

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::DefaultsTest::CompareAndLog
          (DefaultsTest *this,GLfloat value_ref,GLfloat value_dst,GLenum pname)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  float fVar2;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  GLenum local_24;
  GLfloat local_20;
  GLenum pname_local;
  GLfloat value_dst_local;
  GLfloat value_ref_local;
  DefaultsTest *this_local;
  
  local_24 = pname;
  local_20 = value_dst;
  pname_local = (GLenum)value_ref;
  _value_dst_local = this;
  fVar2 = de::abs<float>(value_ref - value_dst);
  if (fVar2 > 0.0125) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [24])"Queried value of pname ");
    EVar3 = glu::getTextureParameterStr(local_24);
    local_1c8[0].m_getName = EVar3.m_getName;
    local_1c8[0].m_value = EVar3.m_value;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1c8);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [14])0x29b79a0);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_20);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [11])0x2a7e7ab);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(float *)&pname_local);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [27])0x2a84efa);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  return fVar2 <= 0.0125;
}

Assistant:

bool DefaultsTest::CompareAndLog(glw::GLfloat value_ref, glw::GLfloat value_dst, glw::GLenum pname)
{
	if (de::abs(value_ref - value_dst) > 0.0125 /* Precision */)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Queried value of pname "
											<< glu::getTextureParameterStr(pname) << " is equal to " << value_dst
											<< ", however " << value_ref << " was expected. Test fails."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}